

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBarPrivate::initDrag(QToolBarPrivate *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QMainWindowLayout *pQVar5;
  DragState *pDVar6;
  QPoint *in_RSI;
  QToolBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QMainWindowLayout *layout;
  QMainWindow *win;
  QToolBar *q;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QPoint local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->state == (DragState *)0x0) {
    qobject_cast<QMainWindow*>((QObject *)0x6eb3d9);
    pQVar5 = qt_mainwindow_layout((QMainWindow *)0x6eb3e8);
    if (pQVar5->pluggingWidget == (QWidget *)0x0) {
      pDVar6 = (DragState *)operator_new(0x18);
      DragState::DragState((DragState *)0x6eb418);
      in_RDI->state = pDVar6;
      in_RDI->state->pressPos = *in_RSI;
      in_RDI->state->dragging = false;
      in_RDI->state->moving = false;
      in_RDI->state->widgetItem = (QLayoutItem *)0x0;
      bVar2 = QWidget::isRightToLeft((QWidget *)0x6eb46a);
      if (bVar2) {
        iVar3 = QWidget::width((QWidget *)0x6eb47a);
        iVar4 = QPoint::x((QPoint *)0x6eb491);
        iVar4 = iVar3 - iVar4;
        QPoint::y((QPoint *)0x6eb4ae);
        QPoint::QPoint((QPoint *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa8);
        in_RDI->state->pressPos = local_10;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarPrivate::initDrag(const QPoint &pos)
{
    Q_Q(QToolBar);

    if (state != nullptr)
        return;

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    Q_ASSERT(win != nullptr);
    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);
    if (layout->pluggingWidget != nullptr) // the main window is animating a docking operation
        return;

    state = new DragState;
    state->pressPos = pos;
    state->dragging = false;
    state->moving = false;
    state->widgetItem = nullptr;

    if (q->isRightToLeft())
        state->pressPos = QPoint(q->width() - state->pressPos.x(), state->pressPos.y());
}